

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

vector<float,_pstd::pmr::polymorphic_allocator<float>_> *
GetFloatPixels(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__return_storage_ptr__,
              Point2i res,int nc)

{
  memory_resource *pmVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  int local_78;
  int local_74;
  float local_60;
  float local_5c;
  ulong local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  pmVar1 = pstd::pmr::new_delete_resource();
  (__return_storage_ptr__->alloc).memoryResource = pmVar1;
  __return_storage_ptr__->ptr = (float *)0x0;
  __return_storage_ptr__->nAlloc = 0;
  __return_storage_ptr__->nStored = 0;
  if (0 < res.super_Tuple2<pbrt::Point2,_int>.y) {
    iVar2 = res.super_Tuple2<pbrt::Point2,_int>.x;
    local_40 = (double)(res.super_Tuple2<pbrt::Point2,_int>.y * iVar2);
    local_74 = 0;
    local_78 = 0;
    local_58 = (ulong)res.super_Tuple2<pbrt::Point2,_int> >> 0x20;
    do {
      if (0 < iVar2) {
        local_50 = (double)local_78 * 0.125;
        iVar3 = 0;
        iVar4 = local_74;
        do {
          if (0 < nc) {
            local_48 = (double)iVar3 * 0.25;
            iVar5 = 0;
            do {
              if (iVar5 == 0) {
                local_38 = sin(local_48);
                dVar6 = cos(local_50);
                local_5c = (float)(dVar6 * local_38);
                pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                          (__return_storage_ptr__,&local_5c);
              }
              else {
                local_60 = (float)(((double)(iVar4 + iVar5) + (double)(iVar4 + iVar5)) / local_40 +
                                  -0.25);
                pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                          (__return_storage_ptr__,&local_60);
              }
              iVar5 = iVar5 + 1;
            } while (nc != iVar5);
          }
          iVar3 = iVar3 + 1;
          iVar4 = iVar4 + 3;
        } while (iVar3 != iVar2);
      }
      local_78 = local_78 + 1;
      local_74 = local_74 + iVar2 * 3;
    } while (local_78 != (int)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

static pstd::vector<float> GetFloatPixels(Point2i res, int nc) {
    pstd::vector<float> p;
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            for (int c = 0; c < nc; ++c)
                if (c == 0)
                    p.push_back(std::sin(x / 4.) * std::cos(y / 8.));
                else
                    p.push_back(-.25 +
                                2. * (c + 3 * x + 3 * y * res[0]) / (res[0] * res[1]));
    return p;
}